

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

size_t sentencepiece::string_util::EncodeUTF8(char32 c,char *output)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  byte bVar5;
  
  if (c < 0x80) {
    sVar3 = 1;
  }
  else if (c < 0x800) {
    output[1] = (byte)c & 0x3f | 0x80;
    c = (char32)(byte)((byte)(c >> 6) | 0xc0);
    sVar3 = 2;
  }
  else {
    uVar4 = 0xfffd;
    if (c < 0x110000) {
      uVar4 = (ulong)c;
    }
    bVar2 = (byte)uVar4 & 0x3f | 0x80;
    bVar5 = (byte)(uVar4 >> 6) & 0x3f | 0x80;
    bVar1 = (byte)(uVar4 >> 0xc);
    if ((uint)uVar4 < 0x10000) {
      output[2] = bVar2;
      output[1] = bVar5;
      c = (char32)(bVar1 | 0xe0);
      sVar3 = 3;
    }
    else {
      output[3] = bVar2;
      output[2] = bVar5;
      output[1] = bVar1 & 0x3f | 0x80;
      sVar3 = 4;
      c = (char32)(byte)((byte)((uint)uVar4 >> 0x12) | 0xf0);
    }
  }
  *output = (char)c;
  return sVar3;
}

Assistant:

size_t EncodeUTF8(char32 c, char *output) {
  if (c <= 0x7F) {
    *output = static_cast<char>(c);
    return 1;
  }

  if (c <= 0x7FF) {
    output[1] = 0x80 | (c & 0x3F);
    c >>= 6;
    output[0] = 0xC0 | c;
    return 2;
  }

  // if `c` is out-of-range, convert it to REPLACEMENT CHARACTER (U+FFFD).
  // This treatment is the same as the original runetochar.
  if (c > 0x10FFFF) c = kUnicodeError;

  if (c <= 0xFFFF) {
    output[2] = 0x80 | (c & 0x3F);
    c >>= 6;
    output[1] = 0x80 | (c & 0x3F);
    c >>= 6;
    output[0] = 0xE0 | c;
    return 3;
  }

  output[3] = 0x80 | (c & 0x3F);
  c >>= 6;
  output[2] = 0x80 | (c & 0x3F);
  c >>= 6;
  output[1] = 0x80 | (c & 0x3F);
  c >>= 6;
  output[0] = 0xF0 | c;

  return 4;
}